

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O3

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args;
  ClockingPropertyExprSyntax *pCVar1;
  DeepCloneVisitor visitor;
  DeepCloneVisitor visitor_1;
  DeepCloneVisitor local_22;
  DeepCloneVisitor local_21;
  SyntaxNode *local_20;
  
  args = detail::
         visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                   (*(SyntaxNode **)(__fn + 0x18),&local_22,(BumpAllocator *)__child_stack);
  if (*(SyntaxNode **)(__fn + 0x20) == (SyntaxNode *)0x0) {
    local_20 = (SyntaxNode *)0x0;
  }
  else {
    local_20 = detail::
               visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::syntax::DeepCloneVisitor,slang::BumpAllocator&>
                         (*(SyntaxNode **)(__fn + 0x20),&local_21,(BumpAllocator *)__child_stack);
  }
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::ClockingPropertyExprSyntax,slang::syntax::TimingControlSyntax&,slang::syntax::PropertyExprSyntax*>
                     ((BumpAllocator *)__child_stack,(TimingControlSyntax *)args,
                      (PropertyExprSyntax **)&local_20);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const ClockingPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ClockingPropertyExprSyntax>(
        *deepClone<TimingControlSyntax>(*node.event, alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr
    );
}